

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::internal::DecodeChildIpv6AddressList
                  (Error *__return_storage_ptr__,
                  vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                  *aChildIpv6AddressInfoList,ByteArray *aBuf)

{
  bool bVar1;
  uchar *aBuf_00;
  Error *aError;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  format_args args;
  ErrorCode local_1c0;
  allocator<unsigned_char> local_1b9;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1b0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1a8;
  ByteArray local_1a0;
  Error local_188;
  anon_class_1_0_00000001 local_14a;
  v10 local_149;
  v10 *local_148;
  size_t local_140;
  string local_138;
  Error local_118;
  undefined1 local_f0 [8];
  ChildIpv6AddrInfo childIpv6AddrsInfo;
  size_t length;
  ByteArray *aBuf_local;
  vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
  *aChildIpv6AddressInfoList_local;
  Error *error;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  Error **local_38;
  undefined1 *local_30;
  Error **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  Error **local_10;
  
  Error::Error(__return_storage_ptr__);
  childIpv6AddrsInfo.mAddrs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
  ChildIpv6AddrInfo::ChildIpv6AddrInfo((ChildIpv6AddrInfo *)local_f0);
  if (((ulong)childIpv6AddrsInfo.mAddrs.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xf) == 2) {
    aBuf_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(aBuf);
    local_f0._0_2_ = utils::Decode<unsigned_short>(aBuf_00,2);
    local_f0._2_2_ = local_f0._0_2_ & 0x1ff;
    local_1b0._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(aBuf);
    local_1a8 = __gnu_cxx::
                __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::operator+(&local_1b0,2);
    local_1b8._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(aBuf);
    std::allocator<unsigned_char>::allocator(&local_1b9);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_1a0,local_1a8,local_1b8
               ,&local_1b9);
    DecodeIpv6AddressList
              (&local_188,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&childIpv6AddrsInfo,&local_1a0);
    aError = Error::operator=(__return_storage_ptr__,&local_188);
    local_1c0 = kNone;
    bVar1 = commissioner::operator!=(aError,&local_1c0);
    Error::~Error(&local_188);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1a0);
    std::allocator<unsigned_char>::~allocator(&local_1b9);
    if (!bVar1) {
      std::
      vector<ot::commissioner::ChildIpv6AddrInfo,std::allocator<ot::commissioner::ChildIpv6AddrInfo>>
      ::emplace_back<ot::commissioner::ChildIpv6AddrInfo&>
                ((vector<ot::commissioner::ChildIpv6AddrInfo,std::allocator<ot::commissioner::ChildIpv6AddrInfo>>
                  *)aChildIpv6AddressInfoList,(ChildIpv6AddrInfo *)local_f0);
    }
  }
  else {
    DecodeChildIpv6AddressList::anon_class_1_0_00000001::operator()(&local_14a);
    local_58 = &local_148;
    local_60 = &local_149;
    bVar2 = ::fmt::v10::operator()(local_60);
    local_140 = bVar2.size_;
    local_148 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_68 = &local_138;
    local_78 = local_148;
    sStack_70 = local_140;
    local_50 = &local_78;
    local_88 = local_148;
    local_80 = local_140;
    local_48 = local_88;
    sStack_40 = local_80;
    error = (Error *)::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_30 = local_98;
    local_38 = &error;
    local_20 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_80;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_138,local_88,fmt,args);
    Error::Error(&local_118,kBadFormat,&local_138);
    Error::operator=(__return_storage_ptr__,&local_118);
    Error::~Error(&local_118);
    std::__cxx11::string::~string((string *)&local_138);
  }
  ChildIpv6AddrInfo::~ChildIpv6AddrInfo((ChildIpv6AddrInfo *)local_f0);
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeChildIpv6AddressList(std::vector<ChildIpv6AddrInfo> &aChildIpv6AddressInfoList,
                                           const ByteArray                &aBuf)
{
    Error             error;
    size_t            length = aBuf.size();
    ChildIpv6AddrInfo childIpv6AddrsInfo;

    VerifyOrExit((length % kIpv6AddressBytes) == kRloc16Bytes,
                 error = ERROR_BAD_FORMAT("premature end of Child IPv6 Address"));
    childIpv6AddrsInfo.mRloc16  = utils::Decode<uint16_t>(aBuf.data(), kRloc16Bytes);
    childIpv6AddrsInfo.mChildId = childIpv6AddrsInfo.mRloc16 & 0x1FF;

    SuccessOrExit(error = DecodeIpv6AddressList(childIpv6AddrsInfo.mAddrs, {aBuf.begin() + kRloc16Bytes, aBuf.end()}));
    aChildIpv6AddressInfoList.emplace_back(childIpv6AddrsInfo);

exit:
    return error;
}